

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_schemes.c
# Opt level: O2

char * nni_http_stream_scheme(char *upper)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 + 0x10 == 0xd0) {
      return (char *)0x0;
    }
    iVar2 = strcmp(*(char **)((long)&http_schemes[0].upper + lVar3),upper);
    lVar1 = lVar3 + 0x10;
  } while (iVar2 != 0);
  return *(char **)((long)&http_schemes[0].lower + lVar3);
}

Assistant:

const char *
nni_http_stream_scheme(const char *upper)
{
	for (int i = 0; http_schemes[i].upper != NULL; i++) {
		if (strcmp(http_schemes[i].upper, upper) == 0) {
			return (http_schemes[i].lower);
		}
	}
	return (NULL);
}